

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_iterrupter.cpp
# Opt level: O0

void __thiscall booster::aio::impl::select_interrupter::notify(select_interrupter *this)

{
  ssize_t sVar1;
  int *piVar2;
  long in_RDI;
  char c;
  undefined1 local_9 [9];
  
  do {
    local_9[0] = 0x41;
    sVar1 = write(*(int *)(in_RDI + 4),local_9,1);
    if (-1 < sVar1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return;
}

Assistant:

void select_interrupter::notify()
	{
		#ifdef BOOSTER_WIN32
		char c='A';
		::send(write_,&c,1,0);
		#else
		for(;;) {
			char c='A';
			if(::write(write_,&c,1) < 0 && errno==EINTR)
				continue;
			break;
		}
		#endif
	}